

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::AddPivotEntry
          (Transformer *this,string *enum_name,
          unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *base,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *column,unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                  *subquery,bool has_parameters)

{
  Transformer *this_00;
  pointer pCVar1;
  undefined7 in_register_00000089;
  templated_unique_single_t result;
  unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
  uStack_78;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_70;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_68;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_60;
  undefined4 local_54;
  string local_50;
  
  if ((this->parent).ptr == (Transformer *)0x0) {
    local_54 = (undefined4)CONCAT71(in_register_00000089,has_parameters);
    make_uniq<duckdb::Transformer::CreatePivotEntry>();
    pCVar1 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&uStack_78);
    ::std::__cxx11::string::operator=((string *)pCVar1,(string *)enum_name);
    pCVar1 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&uStack_78);
    ::std::__uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>::operator=
              ((__uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> *)
               &pCVar1->base,
               (__uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> *)base
              );
    pCVar1 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&uStack_78);
    ::std::__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ::operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)&pCVar1->column,
                (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)column);
    pCVar1 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&uStack_78);
    ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
              ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               &pCVar1->subquery,
               (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               subquery);
    pCVar1 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&uStack_78);
    pCVar1->has_parameters = SUB41(local_54,0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>,std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>,std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>>>
                *)&this->pivot_entries,
               (unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                *)&uStack_78);
    ::std::
    unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
    ::~unique_ptr(&uStack_78);
  }
  else {
    this_00 = optional_ptr<duckdb::Transformer,_true>::operator->(&this->parent);
    ::std::__cxx11::string::string((string *)&local_50,(string *)enum_name);
    local_60._M_head_impl =
         (base->super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    (base->super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = (SelectNode *)0x0;
    local_68._M_head_impl =
         (column->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (column->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    local_70._M_head_impl =
         (subquery->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
         _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (subquery->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    AddPivotEntry(this_00,&local_50,
                  (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
                  &local_60,
                  (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)&local_68,
                  (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                  &local_70,has_parameters);
    if (local_70._M_head_impl != (QueryNode *)0x0) {
      (*(local_70._M_head_impl)->_vptr_QueryNode[1])();
    }
    local_70._M_head_impl = (QueryNode *)0x0;
    if (local_68._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_68._M_head_impl = (ParsedExpression *)0x0;
    if (local_60._M_head_impl != (SelectNode *)0x0) {
      (*((local_60._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
    local_60._M_head_impl = (SelectNode *)0x0;
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Transformer::AddPivotEntry(string enum_name, unique_ptr<SelectNode> base, unique_ptr<ParsedExpression> column,
                                unique_ptr<QueryNode> subquery, bool has_parameters) {
	if (parent) {
		parent->AddPivotEntry(std::move(enum_name), std::move(base), std::move(column), std::move(subquery),
		                      has_parameters);
		return;
	}
	auto result = make_uniq<CreatePivotEntry>();
	result->enum_name = std::move(enum_name);
	result->base = std::move(base);
	result->column = std::move(column);
	result->subquery = std::move(subquery);
	result->has_parameters = has_parameters;

	pivot_entries.push_back(std::move(result));
}